

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall AmpIO::ClearEncoderErrorCount(AmpIO *this,uint index)

{
  uint local_1c;
  bool local_15;
  uint i;
  bool ret;
  uint index_local;
  AmpIO *this_local;
  
  local_15 = true;
  if (index == 0x10) {
    for (local_1c = 0; local_1c < this->NumEncoders; local_1c = local_1c + 1) {
      this->encErrorCount[local_1c] = 0;
    }
  }
  else {
    local_15 = index < this->NumEncoders;
    if (local_15) {
      this->encErrorCount[index] = 0;
    }
  }
  return local_15;
}

Assistant:

bool AmpIO::ClearEncoderErrorCount(unsigned int index)
{
    bool ret = true;
    if (index == MAX_CHANNELS) {
        // Clear all counters
        for (unsigned int i = 0; i < NumEncoders; i++)
            encErrorCount[i] = 0;
    }
    else if (index < NumEncoders) {
        encErrorCount[index] = 0;
    }
    else {
        ret = false;
    }
    return ret;
}